

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     RenderLineSegments<ImPlot::GetterYs<unsigned_short>,ImPlot::GetterYRef,ImPlot::TransformerLogLin>
               (GetterYs<unsigned_short> *getter1,GetterYRef *getter2,TransformerLogLin *transformer
               ,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  double dVar3;
  ushort uVar4;
  int iVar5;
  ImPlotPlot *pIVar6;
  double dVar7;
  float fVar8;
  ImPlotContext *pIVar9;
  ImPlotContext *pIVar10;
  ImPlotContext *pIVar11;
  int iVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  GetterYRef *local_50;
  TransformerLogLin *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  pIVar9 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterYs<unsigned_short>,ImPlot::GetterYRef,ImPlot::TransformerLogLin>>
              ((LineSegmentsRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar12 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar12 = getter1->Count;
    }
    if (0 < iVar12) {
      iVar13 = 0;
      dVar7 = 0.0;
      do {
        pIVar10 = GImPlot;
        iVar5 = getter1->Count;
        uVar4 = *(ushort *)
                 ((long)getter1->Ys +
                 (long)(((getter1->Offset + iVar13) % iVar5 + iVar5) % iVar5) *
                 (long)getter1->Stride);
        dVar14 = log10((getter1->XScale * dVar7 + getter1->X0) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar11 = GImPlot;
        pIVar6 = pIVar10->CurrentPlot;
        dVar3 = (pIVar6->XAxis).Range.Min;
        iVar5 = transformer->YAxis;
        IVar2 = pIVar10->PixelRange[iVar5].Min;
        local_58._0_4_ =
             (undefined4)
             (pIVar10->Mx *
              (((double)(float)(dVar14 / pIVar10->LogDenX) * ((pIVar6->XAxis).Range.Max - dVar3) +
               dVar3) - dVar3) + (double)IVar2.x);
        local_58._4_4_ =
             (undefined4)
             (pIVar10->My[iVar5] * ((double)uVar4 - pIVar6->YAxis[iVar5].Range.Min) +
             (double)IVar2.y);
        dVar3 = getter2->YRef;
        dVar15 = log10((getter2->XScale * dVar7 + getter2->X0) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar6 = pIVar11->CurrentPlot;
        dVar14 = (pIVar6->XAxis).Range.Min;
        iVar5 = transformer->YAxis;
        IVar2 = pIVar11->PixelRange[iVar5].Min;
        local_60.x = (float)(pIVar11->Mx *
                             (((double)(float)(dVar15 / pIVar11->LogDenX) *
                               ((pIVar6->XAxis).Range.Max - dVar14) + dVar14) - dVar14) +
                            (double)IVar2.x);
        local_60.y = (float)(pIVar11->My[iVar5] * (dVar3 - pIVar6->YAxis[iVar5].Range.Min) +
                            (double)IVar2.y);
        pIVar6 = pIVar9->CurrentPlot;
        fVar8 = (float)local_58._4_4_;
        if (local_60.y <= (float)local_58._4_4_) {
          fVar8 = local_60.y;
        }
        if ((fVar8 < (pIVar6->PlotRect).Max.y) &&
           (fVar8 = (float)(~-(uint)(local_60.y <= (float)local_58._4_4_) & (uint)local_60.y |
                           local_58._4_4_ & -(uint)(local_60.y <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar8 && fVar8 != *pfVar1)) {
          fVar8 = (float)local_58._0_4_;
          if (local_60.x <= (float)local_58._0_4_) {
            fVar8 = local_60.x;
          }
          if ((fVar8 < (pIVar6->PlotRect).Max.x) &&
             (fVar8 = (float)(-(uint)(local_60.x <= (float)local_58._0_4_) & local_58._0_4_ |
                             ~-(uint)(local_60.x <= (float)local_58._0_4_) & (uint)local_60.x),
             (pIVar6->PlotRect).Min.x <= fVar8 && fVar8 != (pIVar6->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        dVar7 = dVar7 + 1.0;
        iVar13 = iVar13 + 1;
      } while (iVar12 != iVar13);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}